

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  ushort uVar1;
  Pgno PVar2;
  BtShared *pBt;
  BtLock *pBVar3;
  Pager *pPager;
  u8 *puVar4;
  MemPage *pMVar5;
  uint uVar6;
  char cVar7;
  byte bVar8;
  u16 uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  u32 uVar13;
  u32 uVar14;
  BtLock **ppBVar15;
  Btree *pBVar16;
  uint uVar17;
  Wal *pWal;
  undefined1 auVar18 [16];
  int local_4c;
  u32 local_48;
  Pgno local_44;
  u32 *local_40;
  MemPage *pPage1;
  
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  if ((p->inTrans == '\x02') || (wrflag == 0 && p->inTrans == '\x01')) {
LAB_0011e5b5:
    if (pSchemaVersion != (int *)0x0) {
      uVar14 = sqlite3Get4byte(pBt->pPage1->aData + 0x28);
      *pSchemaVersion = uVar14;
    }
    if (wrflag == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = sqlite3PagerOpenSavepoint(pBt->pPager,p->db->nSavepoint);
    }
    goto LAB_0011e5eb;
  }
  if (((p->db->flags & 0x2000000) != 0) && (pBt->pPager->readOnly == '\0')) {
    *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags & 0xfe;
  }
  if ((wrflag != 0) && ((pBt->btsFlags & 1) != 0)) {
    uVar10 = 8;
    goto LAB_0011e5eb;
  }
  cVar7 = (char)pBt->btsFlags;
  if (wrflag == 0) {
    if (cVar7 < '\0') goto LAB_0011e064;
  }
  else {
    if ((cVar7 < '\0') || (pBt->inTransaction == '\x02')) {
LAB_0011e064:
      pBVar16 = pBt->pWriter;
    }
    else {
      if (wrflag < 2) goto LAB_0011e078;
      ppBVar15 = &pBt->pLock;
      do {
        pBVar3 = *ppBVar15;
        if (pBVar3 == (BtLock *)0x0) goto LAB_0011e078;
        pBVar16 = pBVar3->pBtree;
        ppBVar15 = &pBVar3->pNext;
      } while (pBVar16 == p);
    }
    uVar10 = 0x106;
    if (pBVar16->db != (sqlite3 *)0x0) goto LAB_0011e5eb;
  }
LAB_0011e078:
  uVar10 = querySharedCacheTableLock(p,1,'\x01');
  if (uVar10 == 0) {
    uVar1 = pBt->btsFlags;
    pBt->btsFlags = uVar1 & 0xffef;
    if (pBt->nPage == 0) {
      pBt->btsFlags = uVar1 | 0x10;
    }
    local_40 = &pBt->pageSize;
    uVar10 = 0;
LAB_0011e0b6:
    do {
      if (pBt->pPage1 == (MemPage *)0x0) {
        uVar11 = sqlite3PagerSharedLock(pBt->pPager);
        if ((uVar11 != 0) || (uVar11 = btreeGetPage(pBt,1,&pPage1,0), pMVar5 = pPage1, uVar11 != 0))
        goto LAB_0011e36b;
        puVar4 = pPage1->aData;
        uVar14 = sqlite3Get4byte(puVar4 + 0x1c);
        PVar2 = pBt->pPager->dbSize;
        if ((uVar14 == 0) || (*(int *)(puVar4 + 0x18) != *(int *)(puVar4 + 0x5c))) {
          uVar14 = PVar2;
        }
        if ((pBt->db->flags & 0x2000000) != 0) {
          uVar14 = 0;
        }
        if (uVar14 == 0) {
          uVar13 = pBt->usableSize;
LAB_0011e299:
          uVar11 = 0;
          iVar12 = (uVar13 * 0x40 - 0x300) / 0xff - 0x17;
          pBt->maxLocal = (ushort)iVar12;
          uVar9 = (short)((ulong)(uVar13 * 0x20 - 0x180) / 0xff) - 0x17;
          pBt->minLocal = uVar9;
          pBt->maxLeaf = (short)uVar13 - 0x23;
          if (0x7e < (ushort)iVar12) {
            iVar12 = 0x7f;
          }
          pBt->minLeaf = uVar9;
          pBt->max1bytePayload = (u8)iVar12;
          pBt->pPage1 = pMVar5;
          pBt->nPage = uVar14;
LAB_0011e2f7:
          uVar10 = 0;
          if (uVar11 == 0) goto LAB_0011e0b6;
        }
        else {
          auVar18[0] = -(*puVar4 == 'S');
          auVar18[1] = -(puVar4[1] == 'Q');
          auVar18[2] = -(puVar4[2] == 'L');
          auVar18[3] = -(puVar4[3] == 'i');
          auVar18[4] = -(puVar4[4] == 't');
          auVar18[5] = -(puVar4[5] == 'e');
          auVar18[6] = -(puVar4[6] == ' ');
          auVar18[7] = -(puVar4[7] == 'f');
          auVar18[8] = -(puVar4[8] == 'o');
          auVar18[9] = -(puVar4[9] == 'r');
          auVar18[10] = -(puVar4[10] == 'm');
          auVar18[0xb] = -(puVar4[0xb] == 'a');
          auVar18[0xc] = -(puVar4[0xc] == 't');
          auVar18[0xd] = -(puVar4[0xd] == ' ');
          auVar18[0xe] = -(puVar4[0xe] == '3');
          auVar18[0xf] = -(puVar4[0xf] == '\0');
          uVar11 = 0x1a;
          if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
            if (2 < puVar4[0x12]) {
              *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 1;
            }
            if (puVar4[0x13] < 3) {
              local_44 = PVar2;
              if ((puVar4[0x13] == 2) && ((pBt->btsFlags & 0x20) == 0)) {
                local_4c = 0;
                uVar11 = sqlite3PagerOpenWal(pBt->pPager,&local_4c);
                if (uVar11 == 0) {
                  if (local_4c != 0) goto LAB_0011e3df;
                  releasePageOne(pMVar5);
                  uVar11 = 0;
                  goto LAB_0011e2f7;
                }
              }
              else {
LAB_0011e3df:
                iVar12 = bcmp(puVar4 + 0x15,"@  ",3);
                uVar11 = 0x1a;
                if (iVar12 == 0) {
                  uVar6 = (uint)puVar4[0x10] * 0x100;
                  uVar10 = (uint)puVar4[0x11] * 0x10000;
                  if ((0xffff00ff < (uVar10 + uVar6) - 0x10001) &&
                     (uVar17 = uVar10 | uVar6, ((uVar6 + uVar10) - 1 & uVar17) == 0)) {
                    *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 2;
                    bVar8 = puVar4[0x14];
                    uVar10 = uVar17 - bVar8;
                    if (uVar17 != pBt->pageSize) {
                      releasePageOne(pMVar5);
                      pBt->usableSize = uVar10;
                      pBt->pageSize = uVar17;
                      freeTempSpace(pBt);
                      uVar11 = sqlite3PagerSetPagesize(pBt->pPager,local_40,(uint)bVar8);
                      goto LAB_0011e2f7;
                    }
                    if (((pBt->db->flags & 0x10000001) == 1) || (uVar14 <= local_44)) {
                      uVar11 = 0x1a;
                      if (0x1df < uVar10) {
                        pBt->pageSize = uVar17;
                        pBt->usableSize = uVar10;
                        local_48 = uVar10;
                        uVar13 = sqlite3Get4byte(puVar4 + 0x34);
                        pBt->autoVacuum = uVar13 != 0;
                        uVar13 = sqlite3Get4byte(puVar4 + 0x40);
                        pBt->incrVacuum = uVar13 != 0;
                        uVar13 = local_48;
                        goto LAB_0011e299;
                      }
                    }
                    else {
                      uVar11 = sqlite3CorruptError(0x1033d);
                    }
                  }
                }
              }
            }
          }
          releasePageOne(pMVar5);
          pBt->pPage1 = (MemPage *)0x0;
        }
      }
      else if ((wrflag == 0) || (uVar10 != 0)) {
LAB_0011e360:
        uVar11 = uVar10;
        if (uVar10 == 0) {
          if ((p->inTrans == '\0') &&
             (pBt->nTransaction = pBt->nTransaction + 1, p->sharable != '\0')) {
            (p->lock).eLock = '\x01';
            (p->lock).pNext = pBt->pLock;
            pBt->pLock = &p->lock;
          }
          bVar8 = 2 - (wrflag == 0);
          p->inTrans = bVar8;
          if (pBt->inTransaction < bVar8) {
            pBt->inTransaction = bVar8;
          }
          if (wrflag == 0) goto LAB_0011e5b5;
          pMVar5 = pBt->pPage1;
          pBt->pWriter = p;
          pBt->btsFlags = (ushort)(1 < wrflag) << 6 | pBt->btsFlags & 0xffbf;
          uVar14 = pBt->nPage;
          uVar13 = sqlite3Get4byte(pMVar5->aData + 0x1c);
          if (uVar14 == uVar13) goto LAB_0011e5b5;
          uVar10 = sqlite3PagerWrite(pMVar5->pDbPage);
          if (uVar10 == 0) {
            uVar10 = pBt->nPage;
            *(uint *)(pMVar5->aData + 0x1c) =
                 uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
            ;
            goto LAB_0011e5b5;
          }
          break;
        }
      }
      else {
        uVar11 = 8;
        if ((pBt->btsFlags & 1) == 0) {
          pPager = pBt->pPager;
          uVar11 = pPager->errCode;
          if (uVar11 == 0) {
            pPager->subjInMemory = p->db->temp_store == '\x02';
            if (pPager->eState == '\x01') {
              pWal = pPager->pWal;
              if (pWal != (Wal *)0x0) {
                if ((pPager->exclusiveMode != '\0') && (pWal->exclusiveMode == '\0')) {
                  uVar11 = pagerLockDb(pPager,4);
                  if (uVar11 != 0) goto LAB_0011e0e8;
                  sqlite3WalExclusiveMode(pPager->pWal,1);
                  pWal = pPager->pWal;
                }
                uVar11 = 8;
                if (pWal->readOnly != '\0') goto LAB_0011e36b;
                uVar11 = walLockExclusive(pWal,0,1);
                if (uVar11 != 0) goto LAB_0011e0e8;
                pWal->writeLock = '\x01';
                iVar12 = bcmp(&pWal->hdr,*pWal->apWiData,0x30);
                if (iVar12 == 0) goto LAB_0011e33e;
                walUnlockExclusive(pWal,0,1);
                pWal->writeLock = '\0';
                goto LAB_0011e0f5;
              }
              uVar11 = pagerLockDb(pPager,2);
              if (uVar11 == 0 && 1 < wrflag) {
                uVar11 = pager_wait_on_lock(pPager,4);
              }
              if (uVar11 != 0) goto LAB_0011e0e8;
LAB_0011e33e:
              pPager->eState = '\x02';
              PVar2 = pPager->dbSize;
              pPager->dbHintSize = PVar2;
              pPager->dbFileSize = PVar2;
              pPager->dbOrigSize = PVar2;
              pPager->journalOff = 0;
            }
            uVar10 = newDatabase(pBt);
            goto LAB_0011e360;
          }
LAB_0011e0e8:
          if (uVar11 == 0x205) {
LAB_0011e0f5:
            uVar11 = (uint)(pBt->inTransaction != '\0') << 9 | 5;
          }
        }
      }
LAB_0011e36b:
      uVar10 = uVar11;
      unlockBtreeIfUnused(pBt);
      if ((((char)uVar10 != '\x05') || (pBt->inTransaction != '\0')) ||
         (iVar12 = btreeInvokeBusyHandler(pBt), iVar12 == 0)) break;
    } while( true );
  }
LAB_0011e5eb:
  sqlite3BtreeLeave(p);
  return uVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag, int *pSchemaVersion){
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( pBt->inTransaction==TRANS_WRITE || IfNotOmitAV(pBt->bDoTruncate)==0 );

  if( (p->db->flags & SQLITE_ResetDatabase) 
   && sqlite3PagerIsreadonly(pBt->pPager)==0 
  ){
    pBt->btsFlags &= ~BTS_READ_ONLY;
  }

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  {
    sqlite3 *pBlock = 0;
    /* If another database handle has already opened a write transaction 
    ** on this shared-btree structure and a second write transaction is
    ** requested, return SQLITE_LOCKED.
    */
    if( (wrflag && pBt->inTransaction==TRANS_WRITE)
     || (pBt->btsFlags & BTS_PENDING)!=0
    ){
      pBlock = pBt->pWriter->db;
    }else if( wrflag>1 ){
      BtLock *pIter;
      for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
        if( pIter->pBtree!=p ){
          pBlock = pIter->pBtree->db;
          break;
        }
      }
    }
    if( pBlock ){
      sqlite3ConnectionBlocked(p->db, pBlock);
      rc = SQLITE_LOCKED_SHAREDCACHE;
      goto trans_begun;
    }
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on 
  ** page 1. So if some other shared-cache client already has a write-lock 
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, MASTER_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database 
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pBt->pPager,wrflag>1,sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }else if( rc==SQLITE_BUSY_SNAPSHOT && pBt->inTransaction==TRANS_NONE ){
          /* if there was no transaction opened when this function was
          ** called and SQLITE_BUSY_SNAPSHOT is returned, change the error
          ** code to SQLITE_BUSY. */
          rc = SQLITE_BUSY;
        }
      }
    }
  
    if( rc!=SQLITE_OK ){
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );
  sqlite3PagerResetLockTimeout(pBt->pPager);

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely 
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }

trans_begun:
  if( rc==SQLITE_OK ){
    if( pSchemaVersion ){
      *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
    }
    if( wrflag ){
      /* This call makes sure that the pager has the correct number of
      ** open savepoints. If the second parameter is greater than 0 and
      ** the sub-journal is not already open, then it will be opened here.
      */
      rc = sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
    }
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}